

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_evaluator.cpp
# Opt level: O2

void __thiscall
TestEvaluator_TestBuiltinLenFunc_Test::~TestEvaluator_TestBuiltinLenFunc_Test
          (TestEvaluator_TestBuiltinLenFunc_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestEvaluator, TestBuiltinLenFunc){
    cout << R"(
            ----- test_builtin_function -----
           )" << endl;
    string buff = R"(len
               len("h")
               len("str")
               len(1)
               len()
              )";
    Lexer* l = Lexer::New(buff);
    Parser* parser = Parser::New(l);
    auto env = Evaluator::NewEnvironment();
    auto program = parser->parseProgram();
    auto obj = Evaluator::evalProgram(program, env);
    EXPECT_TRUE(obj.size() == 5);
    EXPECT_EQ(obj.back()->type(), Types::ERRORTYPE);
}